

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::add_compare(bigint *lhs1,bigint *lhs2,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  bigit bVar3;
  bigit bVar4;
  bigit bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  anon_class_1_0_00000001 local_4d;
  uint local_4c;
  bigint *local_48;
  bigint *local_40;
  bigint *local_38;
  
  local_4c = lhs1->exp_;
  iVar9 = (int)(lhs1->bigits_).super_buffer<unsigned_int>.size_ + local_4c;
  uVar1 = lhs2->exp_;
  iVar11 = (int)(lhs2->bigits_).super_buffer<unsigned_int>.size_ + uVar1;
  if (iVar11 < iVar9) {
    iVar11 = iVar9;
  }
  uVar2 = rhs->exp_;
  uVar10 = (ulong)uVar2;
  iVar9 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_ + uVar2;
  if (iVar11 + 1 < iVar9) {
    iVar6 = -1;
  }
  else if (iVar9 < iVar11) {
    iVar6 = 1;
  }
  else {
    if ((int)uVar1 < (int)local_4c) {
      local_4c = uVar1;
    }
    if ((int)uVar2 < (int)local_4c) {
      local_4c = uVar2;
    }
    uVar8 = 0;
    local_48 = lhs1;
    local_40 = lhs2;
    local_38 = rhs;
    while (iVar11 = (int)uVar10, (int)local_4c < iVar9) {
      iVar11 = iVar9 + -1;
      bVar3 = add_compare::anon_class_1_0_00000001::operator()(&local_4d,local_48,iVar11);
      bVar4 = add_compare::anon_class_1_0_00000001::operator()(&local_4d,local_40,iVar11);
      bVar5 = add_compare::anon_class_1_0_00000001::operator()(&local_4d,local_38,iVar11);
      uVar7 = (bVar5 | uVar8) - ((ulong)bVar4 + (ulong)bVar3);
      if ((bVar5 | uVar8) < (ulong)bVar4 + (ulong)bVar3) {
        iVar11 = 1;
        break;
      }
      if (1 < uVar7) {
        iVar11 = -1;
        uVar8 = uVar7;
        break;
      }
      uVar8 = uVar7 << 0x20;
      iVar9 = iVar11;
    }
    iVar6 = -(uint)(uVar8 != 0);
    if ((int)local_4c < iVar9) {
      iVar6 = iVar11;
    }
  }
  return iVar6;
}

Assistant:

int num_bigits() const { return static_cast<int>(bigits_.size()) + exp_; }